

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint8_avx2.h
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::InstanceIntersectorK<8>_>,_false>
     ::intersectCoherent(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,
                        RayQueryContext *context)

{
  undefined1 (*pauVar1) [16];
  ulong *puVar2;
  undefined1 (*pauVar3) [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  bool bVar16;
  uint uVar17;
  undefined4 uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong *puVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  Primitive *prim;
  ulong uVar27;
  undefined1 auVar28 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  vint4 bi;
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined4 in_register_0000149c;
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined4 in_register_0000159c;
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar55 [64];
  Precalculations pre;
  vbool<8> valid_leaf;
  vfloat<4> fmin;
  vint<8> octant;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  Precalculations local_1301;
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_1300;
  undefined1 local_12e0 [16];
  AccelData *local_12c8;
  ulong local_12c0;
  RayHitK<8> *local_12b8;
  RayQueryContext *local_12b0;
  ulong local_12a8;
  ulong local_12a0;
  ulong local_1298;
  undefined1 local_1290 [16];
  float local_1280;
  float fStack_127c;
  float fStack_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined4 uStack_1264;
  float local_1260;
  float fStack_125c;
  float fStack_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined4 uStack_1244;
  undefined1 local_1240 [32];
  uint local_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  undefined4 local_1200;
  undefined4 uStack_11fc;
  undefined4 uStack_11f8;
  undefined4 uStack_11f4;
  uint local_11f0;
  uint uStack_11ec;
  uint uStack_11e8;
  uint uStack_11e4;
  undefined1 local_11e0 [16];
  uint local_11d0;
  uint uStack_11cc;
  uint uStack_11c8;
  uint uStack_11c4;
  undefined1 local_11c0 [16];
  uint local_11b0;
  uint uStack_11ac;
  uint uStack_11a8;
  uint uStack_11a4;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  uint local_1190;
  uint uStack_118c;
  uint uStack_1188;
  uint uStack_1184;
  undefined1 local_1180 [16];
  undefined1 local_1170 [16];
  undefined1 local_1160 [16];
  uint local_1150;
  uint uStack_114c;
  uint uStack_1148;
  uint uStack_1144;
  float local_1140;
  float fStack_113c;
  float fStack_1138;
  float fStack_1134;
  undefined1 local_1130 [16];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined1 local_1040 [32];
  float local_1020;
  float fStack_101c;
  float fStack_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  undefined4 uStack_1004;
  float local_1000;
  float fStack_ffc;
  float fStack_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  undefined4 uStack_fe4;
  float local_fe0;
  float fStack_fdc;
  float fStack_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float fStack_fc8;
  undefined4 uStack_fc4;
  undefined1 local_fc0 [32];
  ulong local_fa0;
  undefined4 local_f98 [2];
  ulong local_f90 [492];
  
  auVar9 = vpcmpeqd_avx2(in_ZMM0._0_32_,in_ZMM0._0_32_);
  auVar28 = vpcmpeqd_avx2(auVar9,(undefined1  [32])valid_i->field_0);
  uVar17 = vmovmskps_avx(auVar28);
  if (uVar17 == 0) {
    return;
  }
  local_12c8 = This->ptr;
  local_12c0 = (ulong)(uVar17 & 0xff);
  auVar4 = *(undefined1 (*) [32])(ray + 0x80);
  auVar34._8_4_ = 0x7fffffff;
  auVar34._0_8_ = 0x7fffffff7fffffff;
  auVar34._12_4_ = 0x7fffffff;
  auVar34._16_4_ = 0x7fffffff;
  auVar34._20_4_ = 0x7fffffff;
  auVar34._24_4_ = 0x7fffffff;
  auVar34._28_4_ = 0x7fffffff;
  auVar35 = vandps_avx(auVar4,auVar34);
  auVar41._8_4_ = 0x219392ef;
  auVar41._0_8_ = 0x219392ef219392ef;
  auVar41._12_4_ = 0x219392ef;
  auVar41._16_4_ = 0x219392ef;
  auVar41._20_4_ = 0x219392ef;
  auVar41._24_4_ = 0x219392ef;
  auVar41._28_4_ = 0x219392ef;
  auVar35 = vcmpps_avx(auVar35,auVar41,1);
  auVar38 = vblendvps_avx(auVar4,auVar41,auVar35);
  auVar35 = vandps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar34);
  auVar35 = vcmpps_avx(auVar35,auVar41,1);
  auVar45 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar41,auVar35);
  auVar35 = vandps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar34);
  auVar35 = vcmpps_avx(auVar35,auVar41,1);
  auVar35 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar41,auVar35);
  auVar34 = vrcpps_avx(auVar38);
  auVar42._8_4_ = 0x3f800000;
  auVar42._0_8_ = &DAT_3f8000003f800000;
  auVar42._12_4_ = 0x3f800000;
  auVar42._16_4_ = 0x3f800000;
  auVar42._20_4_ = 0x3f800000;
  auVar42._24_4_ = 0x3f800000;
  auVar42._28_4_ = 0x3f800000;
  auVar10 = vfnmadd213ps_fma(auVar38,auVar34,auVar42);
  auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar34,auVar34);
  auVar50 = ZEXT1664(auVar10);
  auVar38 = vrcpps_avx(auVar45);
  auVar11 = vfnmadd213ps_fma(auVar45,auVar38,auVar42);
  auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar38,auVar38);
  auVar51 = ZEXT1664(auVar11);
  auVar38 = vrcpps_avx(auVar35);
  auVar37 = vfnmadd213ps_fma(auVar35,auVar38,auVar42);
  auVar37 = vfmadd132ps_fma(ZEXT1632(auVar37),auVar38,auVar38);
  auVar52 = ZEXT1664(auVar37);
  local_1120 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),ZEXT832(0) << 0x20);
  local_1040 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT832(0) << 0x20);
  auVar35._8_4_ = 1;
  auVar35._0_8_ = 0x100000001;
  auVar35._12_4_ = 1;
  auVar35._16_4_ = 1;
  auVar35._20_4_ = 1;
  auVar35._24_4_ = 1;
  auVar35._28_4_ = 1;
  auVar38 = ZEXT832(0) << 0x20;
  auVar4 = vcmpps_avx(auVar4,auVar38,1);
  auVar4 = vandps_avx(auVar4,auVar35);
  auVar35 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar38,1);
  auVar45._8_4_ = 2;
  auVar45._0_8_ = 0x200000002;
  auVar45._12_4_ = 2;
  auVar45._16_4_ = 2;
  auVar45._20_4_ = 2;
  auVar45._24_4_ = 2;
  auVar45._28_4_ = 2;
  auVar35 = vandps_avx(auVar35,auVar45);
  auVar35 = vorps_avx(auVar35,auVar4);
  auVar4 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar38,1);
  auVar38._8_4_ = 4;
  auVar38._0_8_ = 0x400000004;
  auVar38._12_4_ = 4;
  auVar38._16_4_ = 4;
  auVar38._20_4_ = 4;
  auVar38._24_4_ = 4;
  auVar38._28_4_ = 4;
  auVar4 = vandps_avx(auVar4,auVar38);
  auVar9 = vpor_avx2(auVar28 ^ auVar9,auVar4);
  local_1080 = vpor_avx2(auVar9,auVar35);
  local_fe0 = *(float *)ray;
  fStack_fdc = *(float *)(ray + 4);
  fStack_fd8 = *(float *)(ray + 8);
  fStack_fd4 = *(float *)(ray + 0xc);
  fStack_fd0 = *(float *)(ray + 0x10);
  fStack_fcc = *(float *)(ray + 0x14);
  fStack_fc8 = *(float *)(ray + 0x18);
  uStack_fc4 = *(undefined4 *)(ray + 0x1c);
  auVar44._0_4_ = auVar10._0_4_ * -*(float *)ray;
  auVar44._4_4_ = auVar10._4_4_ * -*(float *)(ray + 4);
  auVar44._8_4_ = auVar10._8_4_ * -*(float *)(ray + 8);
  auVar44._12_4_ = auVar10._12_4_ * -*(float *)(ray + 0xc);
  auVar44._16_4_ = -*(float *)(ray + 0x10) * 0.0;
  auVar44._20_4_ = -*(float *)(ray + 0x14) * 0.0;
  auVar44._28_36_ = in_ZMM15._28_36_;
  auVar44._24_4_ = -*(float *)(ray + 0x18) * 0.0;
  auVar55 = ZEXT3264(auVar44._0_32_);
  local_1000 = *(float *)(ray + 0x20);
  fStack_ffc = *(float *)(ray + 0x24);
  fStack_ff8 = *(float *)(ray + 0x28);
  fStack_ff4 = *(float *)(ray + 0x2c);
  fStack_ff0 = *(float *)(ray + 0x30);
  fStack_fec = *(float *)(ray + 0x34);
  fStack_fe8 = *(float *)(ray + 0x38);
  uStack_fe4 = *(undefined4 *)(ray + 0x3c);
  local_1260 = auVar11._0_4_ * -*(float *)(ray + 0x20);
  fStack_125c = auVar11._4_4_ * -*(float *)(ray + 0x24);
  fStack_1258 = auVar11._8_4_ * -*(float *)(ray + 0x28);
  fStack_1254 = auVar11._12_4_ * -*(float *)(ray + 0x2c);
  fStack_1250 = -*(float *)(ray + 0x30) * 0.0;
  fStack_124c = -*(float *)(ray + 0x34) * 0.0;
  fStack_1248 = -*(float *)(ray + 0x38) * 0.0;
  local_1020 = *(float *)(ray + 0x40);
  fStack_101c = *(float *)(ray + 0x44);
  fStack_1018 = *(float *)(ray + 0x48);
  fStack_1014 = *(float *)(ray + 0x4c);
  fStack_1010 = *(float *)(ray + 0x50);
  fStack_100c = *(float *)(ray + 0x54);
  fStack_1008 = *(float *)(ray + 0x58);
  uStack_1004 = *(undefined4 *)(ray + 0x5c);
  local_1280 = auVar37._0_4_ * -*(float *)(ray + 0x40);
  fStack_127c = auVar37._4_4_ * -*(float *)(ray + 0x44);
  fStack_1278 = auVar37._8_4_ * -*(float *)(ray + 0x48);
  fStack_1274 = auVar37._12_4_ * -*(float *)(ray + 0x4c);
  fStack_1270 = -*(float *)(ray + 0x50) * 0.0;
  fStack_126c = -*(float *)(ray + 0x54) * 0.0;
  fStack_1268 = -*(float *)(ray + 0x58) * 0.0;
  local_1210 = 0x80000000;
  uStack_120c = 0x80000000;
  uStack_1208 = 0x80000000;
  uStack_1204 = 0x80000000;
  local_1060 = 0x7f800000;
  uStack_105c = 0x7f800000;
  uStack_1058 = 0x7f800000;
  uStack_1054 = 0x7f800000;
  uStack_1050 = 0x7f800000;
  uStack_104c = 0x7f800000;
  uStack_1048 = 0x7f800000;
  uStack_1044 = 0x7f800000;
  local_10a0 = ZEXT1632(auVar10);
  local_10c0 = ZEXT1632(auVar11);
  local_10e0 = ZEXT1632(auVar37);
  local_1100 = auVar44._0_32_;
  local_12b8 = ray;
  local_12b0 = context;
  uStack_1264 = in_register_0000159c;
  uStack_1244 = in_register_0000149c;
LAB_0060eded:
  lVar21 = 0;
  for (uVar25 = local_12c0; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
    lVar21 = lVar21 + 1;
  }
  uVar18 = *(undefined4 *)(local_1080 + lVar21 * 4);
  auVar28._4_4_ = uVar18;
  auVar28._0_4_ = uVar18;
  auVar28._8_4_ = uVar18;
  auVar28._12_4_ = uVar18;
  auVar28._16_4_ = uVar18;
  auVar28._20_4_ = uVar18;
  auVar28._24_4_ = uVar18;
  auVar28._28_4_ = uVar18;
  auVar38 = vpcmpeqd_avx2(auVar28,local_1080);
  uVar18 = vmovmskps_avx(auVar38);
  local_12c0 = ~CONCAT44((int)((ulong)lVar21 >> 0x20),uVar18) & local_12c0;
  auVar39._8_4_ = 0x7f800000;
  auVar39._0_8_ = 0x7f8000007f800000;
  auVar39._12_4_ = 0x7f800000;
  auVar39._16_4_ = 0x7f800000;
  auVar39._20_4_ = 0x7f800000;
  auVar39._24_4_ = 0x7f800000;
  auVar39._28_4_ = 0x7f800000;
  auVar9 = vblendvps_avx(auVar39,auVar50._0_32_,auVar38);
  auVar28 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vminps_avx(auVar9,auVar28);
  auVar28 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vminps_avx(auVar9,auVar28);
  auVar10 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar9 = vblendvps_avx(auVar39,auVar51._0_32_,auVar38);
  auVar28 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vminps_avx(auVar9,auVar28);
  auVar28 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vminps_avx(auVar9,auVar28);
  auVar11 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar11 = vunpcklps_avx(auVar10,auVar11);
  auVar9 = vblendvps_avx(auVar39,auVar52._0_32_,auVar38);
  auVar28 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vminps_avx(auVar9,auVar28);
  auVar28 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vminps_avx(auVar9,auVar28);
  auVar10 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar53._8_4_ = 0xff800000;
  auVar53._0_8_ = 0xff800000ff800000;
  auVar53._12_4_ = 0xff800000;
  auVar53._16_4_ = 0xff800000;
  auVar53._20_4_ = 0xff800000;
  auVar53._24_4_ = 0xff800000;
  auVar53._28_4_ = 0xff800000;
  auVar9 = vblendvps_avx(auVar53,auVar50._0_32_,auVar38);
  auVar33 = vinsertps_avx(auVar11,auVar10,0x28);
  auVar28 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vmaxps_avx(auVar9,auVar28);
  auVar28 = vshufpd_avx(auVar9,auVar9,5);
  auVar28 = vmaxps_avx(auVar9,auVar28);
  auVar9 = vblendvps_avx(auVar53,auVar51._0_32_,auVar38);
  auVar10 = vmaxps_avx(auVar28._0_16_,auVar28._16_16_);
  auVar28 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vmaxps_avx(auVar9,auVar28);
  auVar28 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vmaxps_avx(auVar9,auVar28);
  auVar11 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar11 = vunpcklps_avx(auVar10,auVar11);
  auVar9 = vblendvps_avx(auVar53,auVar52._0_32_,auVar38);
  auVar28 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vmaxps_avx(auVar9,auVar28);
  auVar28 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vmaxps_avx(auVar9,auVar28);
  auVar10 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar6 = vinsertps_avx(auVar11,auVar10,0x28);
  auVar5 = vcmpps_avx(auVar33,_DAT_01feba10,5);
  auVar10 = vblendvps_avx(auVar6,auVar33,auVar5);
  auVar11 = vmovshdup_avx(auVar10);
  local_1298 = (ulong)(auVar11._0_4_ < 0.0) << 4 | 0x20;
  auVar11 = vshufpd_avx(auVar10,auVar10,1);
  uVar27 = (ulong)(auVar11._0_4_ < 0.0) << 4 | 0x40;
  local_12a0 = local_1298 ^ 0x10;
  local_1140 = auVar10._0_4_;
  auVar15._4_4_ = fStack_fdc;
  auVar15._0_4_ = local_fe0;
  auVar15._8_4_ = fStack_fd8;
  auVar15._12_4_ = fStack_fd4;
  auVar15._16_4_ = fStack_fd0;
  auVar15._20_4_ = fStack_fcc;
  auVar15._24_4_ = fStack_fc8;
  auVar15._28_4_ = uStack_fc4;
  auVar9 = vblendvps_avx(auVar39,auVar15,auVar38);
  auVar28 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vminps_avx(auVar9,auVar28);
  auVar28 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vminps_avx(auVar9,auVar28);
  auVar11 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar14._4_4_ = fStack_ffc;
  auVar14._0_4_ = local_1000;
  auVar14._8_4_ = fStack_ff8;
  auVar14._12_4_ = fStack_ff4;
  auVar14._16_4_ = fStack_ff0;
  auVar14._20_4_ = fStack_fec;
  auVar14._24_4_ = fStack_fe8;
  auVar14._28_4_ = uStack_fe4;
  auVar9 = vblendvps_avx(auVar39,auVar14,auVar38);
  auVar28 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vminps_avx(auVar9,auVar28);
  auVar28 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vminps_avx(auVar9,auVar28);
  auVar37 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar37 = vunpcklps_avx(auVar11,auVar37);
  auVar4._4_4_ = fStack_101c;
  auVar4._0_4_ = local_1020;
  auVar4._8_4_ = fStack_1018;
  auVar4._12_4_ = fStack_1014;
  auVar4._16_4_ = fStack_1010;
  auVar4._20_4_ = fStack_100c;
  auVar4._24_4_ = fStack_1008;
  auVar4._28_4_ = uStack_1004;
  auVar9 = vblendvps_avx(auVar39,auVar4,auVar38);
  auVar28 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vminps_avx(auVar9,auVar28);
  auVar28 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vminps_avx(auVar9,auVar28);
  auVar11 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar37 = vinsertps_avx(auVar37,auVar11,0x28);
  auVar9 = vblendvps_avx(auVar53,auVar15,auVar38);
  auVar28 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vmaxps_avx(auVar9,auVar28);
  auVar28 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vmaxps_avx(auVar9,auVar28);
  auVar11 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar9 = vblendvps_avx(auVar53,auVar14,auVar38);
  auVar28 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vmaxps_avx(auVar9,auVar28);
  auVar28 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vmaxps_avx(auVar9,auVar28);
  auVar7 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar9 = vblendvps_avx(auVar53,auVar4,auVar38);
  auVar7 = vunpcklps_avx(auVar11,auVar7);
  auVar28 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vmaxps_avx(auVar9,auVar28);
  auVar28 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vmaxps_avx(auVar9,auVar28);
  auVar11 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar7 = vinsertps_avx(auVar7,auVar11,0x28);
  auVar11 = vblendvps_avx(auVar7,auVar37,auVar5);
  auVar37 = vblendvps_avx(auVar37,auVar7,auVar5);
  auVar9 = vblendvps_avx(auVar53,local_1040,auVar38);
  auVar28 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar28 = vmaxps_avx(auVar9,auVar28);
  auVar4 = vshufpd_avx(auVar28,auVar28,5);
  auVar4 = vmaxps_avx(auVar28,auVar4);
  auVar28 = vblendvps_avx(auVar39,local_1120,auVar38);
  auVar35 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vminps_avx(auVar28,auVar35);
  auVar35 = vshufpd_avx(auVar28,auVar28,5);
  auVar28 = vminps_avx(auVar28,auVar35);
  auVar8 = vminps_avx(auVar28._0_16_,auVar28._16_16_);
  auVar49 = ZEXT3264(CONCAT428(uStack_1244,
                               CONCAT424(fStack_1248,
                                         CONCAT420(fStack_124c,
                                                   CONCAT416(fStack_1250,
                                                             CONCAT412(fStack_1254,
                                                                       CONCAT48(fStack_1258,
                                                                                CONCAT44(fStack_125c
                                                                                         ,local_1260
                                                                                        ))))))));
  auVar7 = vmaxss_avx(auVar4._0_16_,auVar4._16_16_);
  auVar48 = ZEXT1664(auVar7);
  auVar5 = vblendvps_avx(auVar33,auVar6,auVar5);
  auVar33._0_4_ = auVar37._0_4_ * local_1140;
  auVar33._4_4_ = auVar37._4_4_ * auVar10._4_4_;
  auVar33._8_4_ = auVar37._8_4_ * auVar10._8_4_;
  auVar33._12_4_ = auVar37._12_4_ * auVar10._12_4_;
  local_11a0 = auVar5._0_4_;
  auVar37._0_4_ = auVar11._0_4_ * local_11a0;
  auVar37._4_4_ = auVar11._4_4_ * auVar5._4_4_;
  auVar37._8_4_ = auVar11._8_4_ * auVar5._8_4_;
  auVar37._12_4_ = auVar11._12_4_ * auVar5._12_4_;
  local_12a8 = (ulong)(local_1140 < 0.0) << 4;
  uVar25 = local_12a8 ^ 0x10;
  local_fa0 = *(ulong *)&local_12c8[1].bounds.bounds0.lower.field_0;
  local_f98[0] = 0;
  local_1150 = (uint)auVar33._0_4_ ^ local_1210;
  uStack_114c = (uint)auVar33._0_4_ ^ uStack_120c;
  uStack_1148 = (uint)auVar33._0_4_ ^ uStack_1208;
  uStack_1144 = (uint)auVar33._0_4_ ^ uStack_1204;
  local_1160 = vshufps_avx(auVar10,auVar10,0x55);
  auVar11 = vshufps_avx(auVar33,auVar33,0x55);
  local_1170._0_4_ = auVar11._0_4_ ^ local_1210;
  local_1170._4_4_ = auVar11._4_4_ ^ uStack_120c;
  local_1170._8_4_ = auVar11._8_4_ ^ uStack_1208;
  local_1170._12_4_ = auVar11._12_4_ ^ uStack_1204;
  local_1180 = vshufps_avx(auVar10,auVar10,0xaa);
  auVar10 = vshufps_avx(auVar33,auVar33,0xaa);
  local_1190 = auVar10._0_4_ ^ local_1210;
  uStack_118c = auVar10._4_4_ ^ uStack_120c;
  uStack_1188 = auVar10._8_4_ ^ uStack_1208;
  uStack_1184 = auVar10._12_4_ ^ uStack_1204;
  local_11b0 = (uint)auVar37._0_4_ ^ local_1210;
  uStack_11ac = (uint)auVar37._0_4_ ^ uStack_120c;
  uStack_11a8 = (uint)auVar37._0_4_ ^ uStack_1208;
  uStack_11a4 = (uint)auVar37._0_4_ ^ uStack_1204;
  local_11c0 = vshufps_avx(auVar5,auVar5,0x55);
  auVar10 = vshufps_avx(auVar37,auVar37,0x55);
  local_11d0 = auVar10._0_4_ ^ local_1210;
  uStack_11cc = auVar10._4_4_ ^ uStack_120c;
  uStack_11c8 = auVar10._8_4_ ^ uStack_1208;
  uStack_11c4 = auVar10._12_4_ ^ uStack_1204;
  local_11e0 = vshufps_avx(auVar5,auVar5,0xaa);
  auVar10 = vshufps_avx(auVar37,auVar37,0xaa);
  local_11f0 = auVar10._0_4_ ^ local_1210;
  uStack_11ec = auVar10._4_4_ ^ uStack_120c;
  uStack_11e8 = auVar10._8_4_ ^ uStack_1208;
  uStack_11e4 = auVar10._12_4_ ^ uStack_1204;
  local_1200 = auVar8._0_4_;
  auVar44 = ZEXT3264(auVar9);
  auVar9._4_4_ = uStack_105c;
  auVar9._0_4_ = local_1060;
  auVar9._8_4_ = uStack_1058;
  auVar9._12_4_ = uStack_1054;
  auVar9._16_4_ = uStack_1050;
  auVar9._20_4_ = uStack_104c;
  auVar9._24_4_ = uStack_1048;
  auVar9._28_4_ = uStack_1044;
  local_1240 = vblendvps_avx(auVar9,local_1120,auVar38);
  auVar54 = ZEXT3264(CONCAT428(uStack_1264,
                               CONCAT424(fStack_1268,
                                         CONCAT420(fStack_126c,
                                                   CONCAT416(fStack_1270,
                                                             CONCAT412(fStack_1274,
                                                                       CONCAT48(fStack_1278,
                                                                                CONCAT44(fStack_127c
                                                                                         ,local_1280
                                                                                        ))))))));
  puVar22 = local_f90;
  uStack_11fc = local_1200;
  uStack_11f8 = local_1200;
  uStack_11f4 = local_1200;
  fStack_119c = local_11a0;
  fStack_1198 = local_11a0;
  fStack_1194 = local_11a0;
  fStack_113c = local_1140;
  fStack_1138 = local_1140;
  fStack_1134 = local_1140;
  do {
    local_1290 = auVar48._0_16_;
    uVar18 = auVar48._0_4_;
    local_12e0._4_4_ = uVar18;
    local_12e0._0_4_ = uVar18;
    local_12e0._8_4_ = uVar18;
    local_12e0._12_4_ = uVar18;
LAB_0060f242:
    do {
      if (puVar22 == &local_fa0) {
        if (local_12c0 == 0) {
          return;
        }
        goto LAB_0060eded;
      }
      uVar18 = (undefined4)puVar22[-1];
      auVar30._4_4_ = uVar18;
      auVar30._0_4_ = uVar18;
      auVar30._8_4_ = uVar18;
      auVar30._12_4_ = uVar18;
      auVar30._16_4_ = uVar18;
      auVar30._20_4_ = uVar18;
      auVar30._24_4_ = uVar18;
      auVar30._28_4_ = uVar18;
      auVar48 = ZEXT3264(auVar30);
      puVar22 = puVar22 + -2;
      auVar9 = vcmpps_avx(auVar30,auVar44._0_32_,1);
    } while ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                  (auVar9 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar9 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                SUB321(auVar9 >> 0x7f,0) == '\0') &&
               (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              SUB321(auVar9 >> 0xbf,0) == '\0') &&
             (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar9[0x1f]
            );
    uVar26 = *puVar22;
    while ((uVar26 & 8) == 0) {
      auVar12._4_4_ = uStack_114c;
      auVar12._0_4_ = local_1150;
      auVar12._8_4_ = uStack_1148;
      auVar12._12_4_ = uStack_1144;
      auVar13._4_4_ = fStack_113c;
      auVar13._0_4_ = local_1140;
      auVar13._8_4_ = fStack_1138;
      auVar13._12_4_ = fStack_1134;
      auVar10 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar26 + 0x20 + local_12a8),auVar12,auVar13);
      auVar11 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar26 + 0x20 + local_1298),local_1170,
                                local_1160);
      auVar10 = vpmaxsd_avx(auVar10,auVar11);
      auVar8._4_4_ = uStack_118c;
      auVar8._0_4_ = local_1190;
      auVar8._8_4_ = uStack_1188;
      auVar8._12_4_ = uStack_1184;
      auVar11 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar26 + 0x20 + uVar27),auVar8,local_1180);
      auVar5._4_4_ = uStack_11fc;
      auVar5._0_4_ = local_1200;
      auVar5._8_4_ = uStack_11f8;
      auVar5._12_4_ = uStack_11f4;
      auVar11 = vpmaxsd_avx(auVar11,auVar5);
      local_1130 = vpmaxsd_avx(auVar10,auVar11);
      auVar10._4_4_ = uStack_11ac;
      auVar10._0_4_ = local_11b0;
      auVar10._8_4_ = uStack_11a8;
      auVar10._12_4_ = uStack_11a4;
      auVar7._4_4_ = fStack_119c;
      auVar7._0_4_ = local_11a0;
      auVar7._8_4_ = fStack_1198;
      auVar7._12_4_ = fStack_1194;
      auVar10 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar26 + 0x20 + uVar25),auVar10,auVar7);
      auVar6._4_4_ = uStack_11cc;
      auVar6._0_4_ = local_11d0;
      auVar6._8_4_ = uStack_11c8;
      auVar6._12_4_ = uStack_11c4;
      auVar11 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar26 + 0x20 + local_12a0),auVar6,local_11c0
                               );
      auVar10 = vpminsd_avx(auVar10,auVar11);
      auVar11._4_4_ = uStack_11ec;
      auVar11._0_4_ = local_11f0;
      auVar11._8_4_ = uStack_11e8;
      auVar11._12_4_ = uStack_11e4;
      auVar11 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar26 + 0x20 + (uVar27 ^ 0x10)),auVar11,
                                local_11e0);
      auVar11 = vpminsd_avx(auVar11,local_12e0);
      auVar10 = vpminsd_avx(auVar10,auVar11);
      auVar10 = vcmpps_avx(local_1130,auVar10,2);
      uVar17 = vmovmskps_avx(auVar10);
      if (uVar17 == 0) {
        bVar16 = false;
        uVar20 = uVar26;
      }
      else {
        uVar23 = (ulong)(uVar17 & 0xff);
        auVar48 = ZEXT3264(CONCAT428(0x7f800000,
                                     CONCAT424(0x7f800000,
                                               CONCAT420(0x7f800000,
                                                         CONCAT416(0x7f800000,
                                                                   CONCAT412(0x7f800000,
                                                                             CONCAT48(0x7f800000,
                                                                                                                                                                            
                                                  0x7f8000007f800000)))))));
        uVar24 = 0;
        uVar19 = 8;
        do {
          lVar21 = 0;
          for (uVar20 = uVar23; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
            lVar21 = lVar21 + 1;
          }
          uVar18 = *(undefined4 *)(uVar26 + 0x20 + lVar21 * 4);
          auVar31._4_4_ = uVar18;
          auVar31._0_4_ = uVar18;
          auVar31._8_4_ = uVar18;
          auVar31._12_4_ = uVar18;
          auVar31._16_4_ = uVar18;
          auVar31._20_4_ = uVar18;
          auVar31._24_4_ = uVar18;
          auVar31._28_4_ = uVar18;
          uVar18 = *(undefined4 *)(uVar26 + 0x40 + lVar21 * 4);
          auVar36._4_4_ = uVar18;
          auVar36._0_4_ = uVar18;
          auVar36._8_4_ = uVar18;
          auVar36._12_4_ = uVar18;
          auVar36._16_4_ = uVar18;
          auVar36._20_4_ = uVar18;
          auVar36._24_4_ = uVar18;
          auVar36._28_4_ = uVar18;
          auVar10 = vfmadd213ps_fma(auVar31,auVar50._0_32_,auVar55._0_32_);
          auVar11 = vfmadd213ps_fma(auVar36,auVar51._0_32_,auVar49._0_32_);
          uVar18 = *(undefined4 *)(uVar26 + 0x60 + lVar21 * 4);
          auVar40._4_4_ = uVar18;
          auVar40._0_4_ = uVar18;
          auVar40._8_4_ = uVar18;
          auVar40._12_4_ = uVar18;
          auVar40._16_4_ = uVar18;
          auVar40._20_4_ = uVar18;
          auVar40._24_4_ = uVar18;
          auVar40._28_4_ = uVar18;
          auVar37 = vfmadd213ps_fma(auVar40,auVar52._0_32_,auVar54._0_32_);
          auVar35 = auVar44._0_32_;
          uVar18 = *(undefined4 *)(uVar26 + 0x30 + lVar21 * 4);
          auVar43._4_4_ = uVar18;
          auVar43._0_4_ = uVar18;
          auVar43._8_4_ = uVar18;
          auVar43._12_4_ = uVar18;
          auVar43._16_4_ = uVar18;
          auVar43._20_4_ = uVar18;
          auVar43._24_4_ = uVar18;
          auVar43._28_4_ = uVar18;
          auVar5 = vfmadd213ps_fma(auVar43,auVar50._0_32_,auVar55._0_32_);
          uVar18 = *(undefined4 *)(uVar26 + 0x50 + lVar21 * 4);
          auVar46._4_4_ = uVar18;
          auVar46._0_4_ = uVar18;
          auVar46._8_4_ = uVar18;
          auVar46._12_4_ = uVar18;
          auVar46._16_4_ = uVar18;
          auVar46._20_4_ = uVar18;
          auVar46._24_4_ = uVar18;
          auVar46._28_4_ = uVar18;
          uVar18 = *(undefined4 *)(uVar26 + 0x70 + lVar21 * 4);
          auVar47._4_4_ = uVar18;
          auVar47._0_4_ = uVar18;
          auVar47._8_4_ = uVar18;
          auVar47._12_4_ = uVar18;
          auVar47._16_4_ = uVar18;
          auVar47._20_4_ = uVar18;
          auVar47._24_4_ = uVar18;
          auVar47._28_4_ = uVar18;
          auVar33 = vfmadd213ps_fma(auVar46,auVar51._0_32_,auVar49._0_32_);
          auVar6 = vfmadd213ps_fma(auVar47,auVar52._0_32_,auVar54._0_32_);
          auVar9 = vpminsd_avx2(ZEXT1632(auVar10),ZEXT1632(auVar5));
          auVar28 = vpminsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar33));
          auVar9 = vpmaxsd_avx2(auVar9,auVar28);
          auVar28 = vpminsd_avx2(ZEXT1632(auVar37),ZEXT1632(auVar6));
          auVar28 = vpmaxsd_avx2(auVar28,local_1240);
          auVar9 = vpmaxsd_avx2(auVar9,auVar28);
          auVar28 = vpmaxsd_avx2(ZEXT1632(auVar10),ZEXT1632(auVar5));
          auVar44 = ZEXT3264(auVar35);
          auVar4 = vpmaxsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar33));
          auVar4 = vpminsd_avx2(auVar28,auVar4);
          auVar28 = vpmaxsd_avx2(ZEXT1632(auVar37),ZEXT1632(auVar6));
          auVar28 = vpminsd_avx2(auVar28,auVar35);
          auVar28 = vpminsd_avx2(auVar4,auVar28);
          auVar9 = vcmpps_avx(auVar9,auVar28,2);
          uVar20 = uVar19;
          if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar9 >> 0x7f,0) != '\0') ||
                (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar9 >> 0xbf,0) != '\0') ||
              (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar9[0x1f] < '\0') {
            uVar18 = *(undefined4 *)(local_1130 + lVar21 * 4);
            auVar29._4_4_ = uVar18;
            auVar29._0_4_ = uVar18;
            auVar29._8_4_ = uVar18;
            auVar29._12_4_ = uVar18;
            auVar32._16_4_ = uVar18;
            auVar32._0_16_ = auVar29;
            auVar32._20_4_ = uVar18;
            auVar32._24_4_ = uVar18;
            auVar32._28_4_ = uVar18;
            uVar20 = *(ulong *)(uVar26 + lVar21 * 8);
            auVar9 = vcmpps_avx(auVar32,auVar48._0_32_,1);
            if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar9 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar9 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar9 >> 0x7f,0) == '\0') &&
                  (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar9 >> 0xbf,0) == '\0') &&
                (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar9[0x1f]) {
              *puVar22 = uVar20;
              uVar20 = uVar19;
            }
            else {
              if (uVar19 == 8) {
                auVar48 = ZEXT3264(auVar32);
                goto LAB_0060f45d;
              }
              *puVar22 = uVar19;
              auVar29 = auVar48._0_16_;
              auVar48 = ZEXT3264(auVar32);
            }
            uVar24 = uVar24 + 1;
            *(int *)(puVar22 + 1) = auVar29._0_4_;
            puVar22 = puVar22 + 2;
          }
LAB_0060f45d:
          uVar23 = uVar23 - 1 & uVar23;
          uVar19 = uVar20;
        } while (uVar23 != 0);
        if (uVar20 == 8) {
          bVar16 = false;
        }
        else {
          bVar16 = true;
          if (1 < uVar24) {
            pauVar1 = (undefined1 (*) [16])(puVar22 + -4);
            puVar2 = puVar22 + -2;
            if ((uint)puVar22[-3] < (uint)puVar22[-1]) {
              *(int *)(puVar22 + -3) = (int)puVar22[-1];
              *(ulong *)*pauVar1 = *puVar2;
              local_1300._0_8_ = SUB168(*pauVar1,0);
              *puVar2 = local_1300._0_8_;
              local_1300.i[2] = SUB164(*pauVar1,8);
              *(float *)(puVar22 + -1) = local_1300.v[2];
            }
            if (uVar24 != 2) {
              pauVar3 = (undefined1 (*) [16])(puVar22 + -6);
              if ((uint)puVar22[-5] < (uint)puVar22[-1]) {
                *(int *)(puVar22 + -5) = (int)puVar22[-1];
                *(ulong *)*pauVar3 = *puVar2;
                local_1300._0_8_ = SUB168(*pauVar3,0);
                *puVar2 = local_1300._0_8_;
                local_1300.i[2] = SUB164(*pauVar3,8);
                *(float *)(puVar22 + -1) = local_1300.v[2];
              }
              if ((uint)puVar22[-5] < (uint)puVar22[-3]) {
                auVar10 = *pauVar3;
                *(int *)(puVar22 + -5) = (int)puVar22[-3];
                *(undefined8 *)*pauVar3 = *(undefined8 *)*pauVar1;
                local_1300._0_8_ = auVar10._0_8_;
                *(undefined8 *)*pauVar1 = local_1300._0_8_;
                local_1300.i[2] = auVar10._8_4_;
                *(float *)(puVar22 + -3) = local_1300.v[2];
              }
            }
          }
        }
      }
      uVar26 = uVar20;
      if (!bVar16) goto LAB_0060f242;
    }
    local_1300 = (anon_union_32_3_898e2e57_for_vboolf_impl<8>_1)
                 vcmpps_avx(auVar44._0_32_,auVar48._0_32_,6);
    if (((((((((undefined1  [32])local_1300 >> 0x1f & (undefined1  [32])0x1) ==
              (undefined1  [32])0x0 &&
             ((undefined1  [32])local_1300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
             ) && ((undefined1  [32])local_1300 >> 0x5f & (undefined1  [32])0x1) ==
                  (undefined1  [32])0x0) && SUB321((undefined1  [32])local_1300 >> 0x7f,0) == '\0')
          && ((undefined1  [32])local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
          ) && SUB321((undefined1  [32])local_1300 >> 0xbf,0) == '\0') &&
        ((undefined1  [32])local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
        -1 < local_1300.i[7]._3_1_) goto LAB_0060f68f;
    local_fc0 = auVar44._0_32_;
    lVar21 = (ulong)((uint)uVar26 & 0xf) - 8;
    if (lVar21 != 0) {
      prim = (Primitive *)(uVar26 & 0xfffffffffffffff0);
      do {
        local_12e0._0_8_ = lVar21;
        InstanceIntersectorK<8>::intersect
                  ((vbool<8> *)&local_1300.field_1,&local_1301,ray,context,prim);
        prim = prim + 1;
        lVar21 = local_12e0._0_8_ + -1;
        context = local_12b0;
        ray = local_12b8;
      } while (lVar21 != 0);
    }
    auVar44 = ZEXT3264(local_fc0);
    auVar9 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),local_fc0,1);
    auVar9 = (undefined1  [32])local_1300 & auVar9;
    if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar9 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar9 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar9 >> 0x7f,0) == '\0') &&
          (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar9 >> 0xbf,0) == '\0') &&
        (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar9[0x1f]) {
      auVar50 = ZEXT3264(local_10a0);
      auVar51 = ZEXT3264(local_10c0);
      auVar52 = ZEXT3264(local_10e0);
      auVar55 = ZEXT3264(local_1100);
      auVar49 = ZEXT3264(CONCAT428(uStack_1244,
                                   CONCAT424(fStack_1248,
                                             CONCAT420(fStack_124c,
                                                       CONCAT416(fStack_1250,
                                                                 CONCAT412(fStack_1254,
                                                                           CONCAT48(fStack_1258,
                                                                                    CONCAT44(
                                                  fStack_125c,local_1260))))))));
      auVar54 = ZEXT3264(CONCAT428(uStack_1264,
                                   CONCAT424(fStack_1268,
                                             CONCAT420(fStack_126c,
                                                       CONCAT416(fStack_1270,
                                                                 CONCAT412(fStack_1274,
                                                                           CONCAT48(fStack_1278,
                                                                                    CONCAT44(
                                                  fStack_127c,local_1280))))))));
LAB_0060f68f:
      auVar48 = ZEXT1664(local_1290);
    }
    else {
      auVar9 = vblendvps_avx(local_fc0,*(undefined1 (*) [32])(ray + 0x100),
                             (undefined1  [32])local_1300);
      auVar44 = ZEXT3264(auVar9);
      auVar28 = vshufps_avx(auVar9,auVar9,0xb1);
      auVar9 = vmaxps_avx(auVar9,auVar28);
      auVar28 = vshufpd_avx(auVar9,auVar9,5);
      auVar9 = vmaxps_avx(auVar9,auVar28);
      auVar10 = vmaxss_avx(auVar9._0_16_,auVar9._16_16_);
      auVar48 = ZEXT1664(auVar10);
      auVar50 = ZEXT3264(local_10a0);
      auVar51 = ZEXT3264(local_10c0);
      auVar52 = ZEXT3264(local_10e0);
      auVar55 = ZEXT3264(local_1100);
      auVar49 = ZEXT3264(CONCAT428(uStack_1244,
                                   CONCAT424(fStack_1248,
                                             CONCAT420(fStack_124c,
                                                       CONCAT416(fStack_1250,
                                                                 CONCAT412(fStack_1254,
                                                                           CONCAT48(fStack_1258,
                                                                                    CONCAT44(
                                                  fStack_125c,local_1260))))))));
      auVar54 = ZEXT3264(CONCAT428(uStack_1264,
                                   CONCAT424(fStack_1268,
                                             CONCAT420(fStack_126c,
                                                       CONCAT416(fStack_1270,
                                                                 CONCAT412(fStack_1274,
                                                                           CONCAT48(fStack_1278,
                                                                                    CONCAT44(
                                                  fStack_127c,local_1280))))))));
    }
  } while( true );
}

Assistant:

static __forceinline vboolf8 operator ==(const vint8& a, const vint8& b) { return _mm256_castsi256_ps(_mm256_cmpeq_epi32(a, b)); }